

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u16 cellSizePtr(MemPage *pPage,u8 *pCell)

{
  uint uVar1;
  byte *pbVar2;
  byte *pbVar3;
  bool local_31;
  uint local_2c;
  int minLocal;
  u32 nSize;
  u8 *pEnd;
  u8 *pIter;
  u8 *pCell_local;
  MemPage *pPage_local;
  
  pbVar2 = pCell + (int)(uint)pPage->childPtrSize;
  local_2c = (uint)*pbVar2;
  pEnd = pbVar2;
  if (0x7f < local_2c) {
    local_2c = local_2c & 0x7f;
    do {
      pbVar3 = pEnd + 1;
      local_2c = local_2c << 7 | pEnd[1] & 0x7f;
      local_31 = 0x7f < *pbVar3 && pbVar3 < pbVar2 + 8;
      pEnd = pbVar3;
    } while (local_31);
  }
  if (pPage->maxLocal < local_2c) {
    uVar1 = (uint)pPage->minLocal;
    local_2c = uVar1 + (local_2c - uVar1) % (pPage->pBt->usableSize - 4);
    if (pPage->maxLocal < local_2c) {
      local_2c = uVar1;
    }
    local_2c._0_2_ = ((short)(pEnd + 1) - (short)pCell) + 4 + (short)local_2c;
  }
  else {
    local_2c = ((int)(pEnd + 1) - (int)pCell) + local_2c;
    if (local_2c < 4) {
      local_2c = 4;
    }
  }
  return (u16)local_2c;
}

Assistant:

static u16 cellSizePtr(MemPage *pPage, u8 *pCell){
  u8 *pIter = pCell + pPage->childPtrSize; /* For looping over bytes of pCell */
  u8 *pEnd;                                /* End mark for a varint */
  u32 nSize;                               /* Size value to return */

#ifdef SQLITE_DEBUG
  /* The value returned by this function should always be the same as
  ** the (CellInfo.nSize) value found by doing a full parse of the
  ** cell. If SQLITE_DEBUG is defined, an assert() at the bottom of
  ** this function verifies that this invariant is not violated. */
  CellInfo debuginfo;
  pPage->xParseCell(pPage, pCell, &debuginfo);
#endif

  nSize = *pIter;
  if( nSize>=0x80 ){
    pEnd = &pIter[8];
    nSize &= 0x7f;
    do{
      nSize = (nSize<<7) | (*++pIter & 0x7f);
    }while( *(pIter)>=0x80 && pIter<pEnd );
  }
  pIter++;
  testcase( nSize==pPage->maxLocal );
  testcase( nSize==(u32)pPage->maxLocal+1 );
  if( nSize<=pPage->maxLocal ){
    nSize += (u32)(pIter - pCell);
    if( nSize<4 ) nSize = 4;
  }else{
    int minLocal = pPage->minLocal;
    nSize = minLocal + (nSize - minLocal) % (pPage->pBt->usableSize - 4);
    testcase( nSize==pPage->maxLocal );
    testcase( nSize==(u32)pPage->maxLocal+1 );
    if( nSize>pPage->maxLocal ){
      nSize = minLocal;
    }
    nSize += 4 + (u16)(pIter - pCell);
  }
  assert( nSize==debuginfo.nSize || CORRUPT_DB );
  return (u16)nSize;
}